

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O2

pair<const_unsigned_long,_unsigned_long> __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Get
          (LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this
          ,unsigned_long *key)

{
  MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
  *this_00;
  Node NVar1;
  Node *in_RAX;
  out_of_range *this_01;
  Locator locator;
  
  this_00 = &this->epoch_;
  locator.pos = in_RAX;
  FASTER::core::LightEpoch::ReentrantProtect(&this_00->inner_epoch_);
  Locator::Locator(&locator,this,key,*key);
  if (locator.pos != (Node *)0x0) {
    NVar1 = locator.pos[1];
    FASTER::core::LightEpoch::ReentrantUnprotect(&this_00->inner_epoch_);
    return (pair<const_unsigned_long,_unsigned_long>)NVar1;
  }
  FASTER::core::LightEpoch::ReentrantProtect(&this_00->inner_epoch_);
  this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_01,"No element found");
  __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline std::pair<const Key, T> Get(const Key &key) {
        epoch_.EnterEpoch();
        Locator locator(*this, key, Hash()(key), get_type());
        if (locator.pos == nullptr) {
            epoch_.EnterEpoch();
            throw std::out_of_range("No element found");
        }
        DataNode *dataNode = static_cast<DataNode *>(locator.pos);
        std::pair<const Key, T> ret{dataNode->data.key, dataNode->data.mapped};
        epoch_.LeaveEpoch();
        return ret;
    }